

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::additive_expr(analysis *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  undefined8 uVar3;
  TYPE TVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  analysis *in_RSI;
  NodePtr NVar6;
  NodePtr ret;
  NodePtr tmp_cur_ptr;
  NodePtr tmp_ptr;
  NodePtr tmp_in_ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_f0 [2];
  undefined1 local_d9;
  NodePtr local_d8;
  int local_bc;
  NodePtr local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [32];
  const_iterator local_78;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  
  a_Stack_f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  multiplicative_expr((analysis *)&local_b8);
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  _Var5._M_pi = local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (TVar4 == ADDOP) {
    token::getVal_abi_cxx11_
              ((string *)local_98,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_a8._M_pi._0_4_ =
         token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
    local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
              (&local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (TreeNode **)&local_d8,(allocator<dh::TreeNode> *)&local_bc,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               (int *)&local_a8);
    _Var1._M_pi = local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar2 = local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var5._M_pi = a_Stack_f0[0]._M_pi;
    local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    a_Stack_f0[0]._M_pi = _Var1._M_pi;
    if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
    }
    if (local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((FILE *)local_98._0_8_ != (FILE *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_);
    }
    token::getVal_abi_cxx11_
              ((string *)&local_50,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    match(in_RSI,(string *)&local_50);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_allocated_capacity != &local_40)
    {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
    local_98._0_4_ = 1;
    TreeNode::setNodeKind(peVar2,(int *)local_98);
    local_98._0_4_ = 5;
    TreeNode::setKind(peVar2,(int *)local_98);
    TreeNode::appendChild(peVar2,&local_b8);
    local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_f0[0]._M_pi;
    if ((element_type *)a_Stack_f0[0]._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((shared_ptr<dh::symTab> *)&(a_Stack_f0[0]._M_pi)->_M_use_count)->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)&(a_Stack_f0[0]._M_pi)->_M_use_count)->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((shared_ptr<dh::symTab> *)&(a_Stack_f0[0]._M_pi)->_M_use_count)->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)&(a_Stack_f0[0]._M_pi)->_M_use_count)->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      }
    }
    local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    local_78._M_current = (token *)this;
    while( true ) {
      multiplicative_expr((analysis *)local_98);
      uVar3 = local_98._8_8_;
      local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_98._0_8_;
      _Var5._M_pi = local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_98._0_8_ = (FILE *)0x0;
      local_98._8_8_ = (element_type *)0x0;
      local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
      if ((element_type *)_Var5._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
      }
      if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
      TreeNode::appendChild
                (local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_b8);
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      peVar2 = local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (TVar4 != ADDOP) break;
      token::getVal_abi_cxx11_
                ((string *)local_98,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_bc = token::getLineno((in_RSI->tmp).
                                  super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
                (&local_a0,(TreeNode **)&local_a8,(allocator<dh::TreeNode> *)&local_d9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_bc);
      if ((FILE *)local_98._0_8_ != (FILE *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
      token::getVal_abi_cxx11_
                ((string *)local_70,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      match(in_RSI,(string *)local_70);
      if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      local_98._0_4_ = 1;
      TreeNode::setNodeKind((TreeNode *)local_a8._M_pi,(int *)local_98);
      local_98._0_4_ = 5;
      TreeNode::setKind((TreeNode *)local_a8._M_pi,(int *)local_98);
      TreeNode::appendChild((TreeNode *)local_a8._M_pi,&local_d8);
      local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_a8._M_pi;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_a0);
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_f0,
               &local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var5._M_pi = extraout_RDX_00;
    if ((element_type *)
        local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var5._M_pi = extraout_RDX_01;
    }
    _Var1._M_pi = a_Stack_f0[0]._M_pi;
    ((local_78._M_current)->_val)._M_dataplus._M_p = (pointer)peVar2;
    (((shared_ptr<dh::symTab> *)&((local_78._M_current)->_val)._M_string_length)->
    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    a_Stack_f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((shared_ptr<dh::symTab> *)&((local_78._M_current)->_val)._M_string_length)->
    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)_Var1._M_pi
    ;
    this = (analysis *)local_78._M_current;
  }
  else {
    *(element_type **)this =
         local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var5._M_pi;
    local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    _Var5._M_pi = extraout_RDX;
  }
  if ((element_type *)
      local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var5._M_pi = extraout_RDX_02;
  }
  if (a_Stack_f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_f0[0]._M_pi);
    _Var5._M_pi = extraout_RDX_03;
  }
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi
  ;
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::additive_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in additive_expr\n";
#endif
	NodePtr ret;
	NodePtr tmp_ptr = multiplicative_expr();

	if ( tmp->getType() == TYPE::ADDOP)
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
		match(tmp->getVal());

		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::AdditiveK);
		ret->appendChild(tmp_ptr);

		NodePtr tmp_cur_ptr = ret;
		while (1)
		{
			tmp_ptr = multiplicative_expr();
			tmp_cur_ptr->appendChild(tmp_ptr);

			if ( tmp->getType() == TYPE::ADDOP)
			{
				NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
				match(tmp->getVal());
				tmp_in_ptr->setNodeKind(NodeKind::ExprK);
				tmp_in_ptr->setKind(ExprKind::AdditiveK);
				tmp_in_ptr->appendChild(tmp_cur_ptr);
				tmp_cur_ptr = tmp_in_ptr;
			} else 
			{
				ret = tmp_cur_ptr;
				break;
			}
		}

	} else 
	{
		return tmp_ptr;
	}

	return ret;
}